

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O0

Nwk_Grf_t * Nwk_ManGraphAlloc(int nVertsMax)

{
  int iVar1;
  Nwk_Grf_t *__s;
  Nwk_Edg_t **ppNVar2;
  Aig_MmFixed_t *pAVar3;
  Vec_Int_t *pVVar4;
  Nwk_Grf_t *p;
  int nVertsMax_local;
  
  __s = (Nwk_Grf_t *)malloc(0xe0);
  memset(__s,0,0xe0);
  __s->nVertsMax = nVertsMax;
  iVar1 = Abc_PrimeCudd(nVertsMax * 3);
  __s->nEdgeHash = iVar1;
  ppNVar2 = (Nwk_Edg_t **)calloc((long)__s->nEdgeHash,8);
  __s->pEdgeHash = ppNVar2;
  pAVar3 = Aig_MmFixedStart(0x10,__s->nEdgeHash);
  __s->pMemEdges = pAVar3;
  pVVar4 = Vec_IntAlloc(1000);
  __s->vPairs = pVVar4;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the graph.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Nwk_Grf_t * Nwk_ManGraphAlloc( int nVertsMax )
{
    Nwk_Grf_t * p;
    p = ABC_ALLOC( Nwk_Grf_t, 1 );
    memset( p, 0, sizeof(Nwk_Grf_t) );
    p->nVertsMax = nVertsMax;
    p->nEdgeHash = Abc_PrimeCudd( 3 * nVertsMax );
    p->pEdgeHash = ABC_CALLOC( Nwk_Edg_t *, p->nEdgeHash );
    p->pMemEdges = Aig_MmFixedStart( sizeof(Nwk_Edg_t), p->nEdgeHash );
    p->vPairs    = Vec_IntAlloc( 1000 );
    return p;
}